

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridDataType2.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::GridDataType2::GridDataType2
          (GridDataType2 *this,KUINT16 SampleType,KUINT16 DataRepresentation,KDataStream *stream)

{
  undefined1 *T;
  uint in_EAX;
  KUINT16 i;
  ushort uVar1;
  KFLOAT32 tmp;
  undefined8 uStack_38;
  
  uStack_38._0_4_ = in_EAX;
  GridData::GridData(&this->super_GridData);
  (this->super_GridData).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__GridDataType2_0021a0a0;
  (this->m_vf32Values).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_vf32Values).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vf32Values).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_GridData).m_ui16SmpTyp = SampleType;
  (this->super_GridData).m_ui16DtRep = DataRepresentation;
  T = &(this->super_GridData).field_0xc;
  KDataStream::Read<unsigned_short>(stream,(unsigned_short *)T);
  uStack_38 = (ulong)(uint)uStack_38;
  for (uVar1 = 0; uVar1 < *(ushort *)T; uVar1 = uVar1 + 1) {
    KDataStream::Read<float>(stream,(float *)((long)&uStack_38 + 4));
    std::vector<float,_std::allocator<float>_>::push_back
              (&this->m_vf32Values,(float *)((long)&uStack_38 + 4));
  }
  KDataStream::Read<unsigned_short>(stream,&this->m_ui16Padding);
  return;
}

Assistant:

GridDataType2::GridDataType2( KUINT16 SampleType, KUINT16 DataRepresentation, KDataStream & stream )
{
    m_ui16SmpTyp = SampleType;
    m_ui16DtRep = DataRepresentation;

    stream >> m_ui16NumValues;

    KFLOAT32 tmp = 0;
    for( KUINT16 i = 0; i < m_ui16NumValues; ++i )
    {
        stream >> tmp;
        m_vf32Values.push_back( tmp );
    }

    stream >> m_ui16Padding;
}